

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O0

void __thiscall GPIOClass::GPIOClass(GPIOClass *this,string *gnum)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  return;
}

Assistant:

GPIOClass::GPIOClass(string gnum)
{
    this->gpionum = gnum;  //Instatiate GPIOClass object for GPIO pin number "gnum"
}